

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractprintdialog.cpp
# Opt level: O1

void __thiscall QAbstractPrintDialog::setFromTo(QAbstractPrintDialog *this,int from,int to)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  QPrinter::setFromTo(*(QPrinter **)(lVar1 + 0x2e0),from,to);
  if ((*(int *)(lVar1 + 0x31c) == 0) && (*(int *)(lVar1 + 800) == 0)) {
    lVar1 = *(long *)(this + 8);
    *(undefined4 *)(lVar1 + 0x31c) = 1;
    *(int *)(lVar1 + 800) = to;
    *(byte *)(lVar1 + 0x318) = *(byte *)(lVar1 + 0x318) | 4;
  }
  return;
}

Assistant:

void QAbstractPrintDialog::setFromTo(int from, int to)
{
    Q_D(QAbstractPrintDialog);
    Q_ASSERT_X(from <= to, "QAbstractPrintDialog::setFromTo",
               "'from' must be less than or equal to 'to'");
    d->printer->setFromTo(from, to);

    if (d->minPage == 0 && d->maxPage == 0)
        setMinMax(1, to);
}